

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O0

int login(string *cmd,int socket_fd,string *currUser,
         vector<cUser,_std::allocator<cUser>_> *currUsers,int id,bool *msgFlags,
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *msgs)

{
  bool bVar1;
  reference paVar2;
  reference this;
  pointer paVar3;
  reference pvVar4;
  ssize_t sVar5;
  ostream *poVar6;
  anon_struct_40_2_6a8bb0e8 local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300 [32];
  undefined1 local_2e0 [8];
  cUser user;
  iterator __end3;
  iterator __begin3;
  vector<cUser,_std::allocator<cUser>_> *__range3;
  anon_class_32_1_d815ae54_for__M_pred local_298;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> local_278;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> local_270;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> local_268;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> currUsersIt;
  anon_class_64_2_84df61a8_for__M_pred local_258;
  __normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> local_218;
  __normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> local_210;
  __normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> local_208;
  __normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> it;
  string local_1e0 [32];
  undefined8 local_1c0;
  size_t spacePos;
  undefined1 local_1a8 [8];
  vector<User,_std::allocator<User>_> users;
  int numbytes;
  char command [256];
  string local_80 [8];
  string password;
  string local_60 [8];
  string username;
  bool *msgFlags_local;
  int id_local;
  vector<cUser,_std::allocator<cUser>_> *currUsers_local;
  string *currUser_local;
  int socket_fd_local;
  string *cmd_local;
  
  std::__cxx11::string::string(local_60);
  std::__cxx11::string::string(local_80);
  users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  getUsers();
  local_1c0 = std::__cxx11::string::find((char *)cmd,0x118219);
  std::__cxx11::string::substr((ulong)local_1e0,(ulong)cmd);
  std::__cxx11::string::operator=(local_60,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::substr((ulong)&it,(ulong)cmd);
  std::__cxx11::string::operator=(local_80,(string *)&it);
  std::__cxx11::string::~string((string *)&it);
  local_210._M_current =
       (anon_struct_64_2_84df61a8 *)
       std::vector<User,_std::allocator<User>_>::begin
                 ((vector<User,_std::allocator<User>_> *)local_1a8);
  local_218._M_current =
       (anon_struct_64_2_84df61a8 *)
       std::vector<User,_std::allocator<User>_>::end
                 ((vector<User,_std::allocator<User>_> *)local_1a8);
  std::__cxx11::string::string((string *)&local_258,local_60);
  std::__cxx11::string::string((string *)&local_258.password,local_80);
  local_208 = std::
              find_if<__gnu_cxx::__normal_iterator<User*,std::vector<User,std::allocator<User>>>,login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                        (local_210,local_218,&local_258);
  login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
  ::$_0::~__0((__0 *)&local_258);
  currUsersIt._M_current =
       (anon_struct_40_2_6a8bb0e8 *)
       std::vector<User,_std::allocator<User>_>::end
                 ((vector<User,_std::allocator<User>_> *)local_1a8);
  bVar1 = __gnu_cxx::operator!=
                    (&local_208,
                     (__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> *)
                     &currUsersIt);
  if (bVar1) {
    local_270._M_current =
         (anon_struct_40_2_6a8bb0e8 *)std::vector<cUser,_std::allocator<cUser>_>::begin(currUsers);
    local_278._M_current =
         (anon_struct_40_2_6a8bb0e8 *)std::vector<cUser,_std::allocator<cUser>_>::end(currUsers);
    std::__cxx11::string::string((string *)&local_298,local_60);
    local_268 = std::
                find_if<__gnu_cxx::__normal_iterator<cUser*,std::vector<cUser,std::allocator<cUser>>>,login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                          (local_270,local_278,&local_298);
    login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
    ::$_1::~__1((__1 *)&local_298);
    __range3 = (vector<cUser,_std::allocator<cUser>_> *)
               std::vector<cUser,_std::allocator<cUser>_>::end(currUsers);
    bVar1 = __gnu_cxx::operator==
                      (&local_268,
                       (__normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> *)
                       &__range3);
    if (bVar1) {
      sVar5 = send(socket_fd,"Login Confirmed",0x14,0);
      if (sVar5 == -1) {
        perror("send");
      }
      __end3 = std::vector<cUser,_std::allocator<cUser>_>::begin(currUsers);
      user._32_8_ = std::vector<cUser,_std::allocator<cUser>_>::end(currUsers);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_>
                                         *)&user.id), bVar1) {
        paVar2 = __gnu_cxx::__normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_>
                 ::operator*(&__end3);
        anon_struct_40_2_6a8bb0e8::cUser((anon_struct_40_2_6a8bb0e8 *)local_2e0,paVar2);
        paVar3 = __gnu_cxx::__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>::
                 operator->(&local_208);
        std::operator+(local_300,(char *)paVar3);
        this = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](msgs,(long)(int)user._24_4_);
        std::__cxx11::string::operator=((string *)this,(string *)local_300);
        std::__cxx11::string::~string((string *)local_300);
        msgFlags[(int)user._24_4_] = true;
        anon_struct_40_2_6a8bb0e8::~cUser((anon_struct_40_2_6a8bb0e8 *)local_2e0);
        __gnu_cxx::__normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_>::
        operator++(&__end3);
      }
      paVar3 = __gnu_cxx::__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>::
               operator->(&local_208);
      std::operator+(local_320,(char *)paVar3);
      poVar6 = std::operator<<((ostream *)&std::cout,(string *)local_320);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_320);
      paVar3 = __gnu_cxx::__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>::
               operator->(&local_208);
      std::__cxx11::string::operator=((string *)currUser,(string *)paVar3);
      local_348._16_8_ = 0;
      local_348._24_8_ = 0;
      local_348.username = (string)0x0;
      local_348._1_7_ = 0;
      local_348._8_8_ = 0;
      local_348.id = 0;
      local_348._36_4_ = 0;
      anon_struct_40_2_6a8bb0e8::cUser(&local_348);
      std::vector<cUser,_std::allocator<cUser>_>::push_back(currUsers,&local_348);
      anon_struct_40_2_6a8bb0e8::~cUser(&local_348);
      paVar3 = __gnu_cxx::__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>::
               operator->(&local_208);
      pvVar4 = std::vector<cUser,_std::allocator<cUser>_>::back(currUsers);
      std::__cxx11::string::operator=((string *)pvVar4,(string *)paVar3);
      pvVar4 = std::vector<cUser,_std::allocator<cUser>_>::back(currUsers);
      pvVar4->id = id;
      cmd_local._4_4_ = 1;
      goto LAB_0010f424;
    }
    sVar5 = send(socket_fd,"User is already logged in",0x1e,0);
    if (sVar5 == -1) {
      perror("user already logged in");
    }
  }
  sVar5 = send(socket_fd,"Invalid Username or Password",0x28,0);
  if (sVar5 == -1) {
    perror("send");
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"Invalid username or password");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  cmd_local._4_4_ = 0;
LAB_0010f424:
  std::vector<User,_std::allocator<User>_>::~vector
            ((vector<User,_std::allocator<User>_> *)local_1a8);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_60);
  return cmd_local._4_4_;
}

Assistant:

int login(string cmd, int socket_fd, string* currUser,vector<cUser>& currUsers,
    int id, bool* msgFlags, vector<string>& msgs){

    string username;
    string password;
    char command[MAXDATASIZE];
    int numbytes = 0;

    //get the current user's usernames and passwords from the userfile
    vector<User> users = getUsers();

    //parse the command string given to the function
    //if no sername or password this step will catch that and not error out
    size_t spacePos = cmd.find(" ");
    username = cmd.substr(0,spacePos);
    password = cmd.substr(spacePos+1);


    //search through all the users and check for usersname and password
    auto it = find_if(users.begin(),users.end(),[username,password](User u){
        return (u.username == username && u.password == password);
    });

    //if the find function found a match, then add the users name and
    // send confirmation
    if(it != users.end()){
        auto currUsersIt = find_if(currUsers.begin(),currUsers.end(),[username](cUser u){
            return (u.username == username);
        });

        //check if the user is already logged in
        if(currUsersIt == currUsers.end()){

            if(send(socket_fd, "Login Confirmed",20,0) == -1)
                perror("send");

            //broadcast the user has joined
            for(cUser user : currUsers){
                msgs[user.id] = string(it->username + " has joined");
                msgFlags[user.id] = true;
            }

            cout << it->username + " Login." << endl;

            //add evertyhing to the currently logged in users list
            *currUser = it->username;
            currUsers.push_back(cUser());
            currUsers.back().username = it->username;
            currUsers.back().id = id;

            return 1;
        }
        else{
            if(send(socket_fd, "User is already logged in",30,0) == -1)
                perror("user already logged in");
        }

    }

    //otherwise error
    if(send(socket_fd, "Invalid Username or Password",40,0) == -1)
        perror("send");
    cout << "Invalid username or password" << endl;

    return 0;

}